

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O1

void __thiscall Logic_FoldOrder_Test::~Logic_FoldOrder_Test(Logic_FoldOrder_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Logic, FoldOrder) {
	MockParser mock(
		"let a = 3\n"
		"let b = 4\n"
		"let c = 3 > 4\n"
		"let d = 3 <= 3\n"
		"let e = 10 < (5 + 6)"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);
	INS2(BC_SET_P, 2, PRIM_FALSE);
	INS2(BC_SET_P, 3, PRIM_TRUE);
	INS2(BC_SET_P, 4, PRIM_TRUE);
	INS(BC_RET, 0, 0, 0);
}